

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strchr.c
# Opt level: O2

int main(void)

{
  undefined8 in_RAX;
  char *pcVar1;
  size_t sVar2;
  char abccd [6];
  undefined2 uStack_2;
  
  _abccd = CONCAT26((short)((ulong)in_RAX >> 0x30),0x6400000000);
  _abccd = CONCAT44(stack0xfffffffffffffffc,0x63636261);
  pcVar1 = strchr(abccd,0x78);
  if (pcVar1 != (char *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strchr.c, line %d - %s\n"
           ,0x21,"strchr( abccd, \'x\' ) == NULL");
    if (abccd[0] != 'a') {
      TEST_RESULTS = TEST_RESULTS + 1;
      printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strchr.c, line %d - %s\n"
             ,0x22,"strchr( abccd, \'a\' ) == &abccd[0]");
    }
  }
  pcVar1 = strchr(abccd,100);
  if (pcVar1 != abccd + 4) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strchr.c, line %d - %s\n"
           ,0x23,"strchr( abccd, \'d\' ) == &abccd[4]");
  }
  sVar2 = strlen(abccd);
  if (sVar2 != 5) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strchr.c, line %d - %s\n"
           ,0x24,"strchr( abccd, \'\\0\' ) == &abccd[5]");
  }
  pcVar1 = strchr(abccd,99);
  if (pcVar1 != abccd + 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strchr.c, line %d - %s\n"
           ,0x25,"strchr( abccd, \'c\' ) == &abccd[2]");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char abccd[] = "abccd";
    TESTCASE( strchr( abccd, 'x' ) == NULL );
    TESTCASE( strchr( abccd, 'a' ) == &abccd[0] );
    TESTCASE( strchr( abccd, 'd' ) == &abccd[4] );
    TESTCASE( strchr( abccd, '\0' ) == &abccd[5] );
    TESTCASE( strchr( abccd, 'c' ) == &abccd[2] );
    return TEST_RESULTS;
}